

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

void __thiscall
SourceMapTest_SourceMapSourceRootFile_Test::TestBody
          (SourceMapTest_SourceMapSourceRootFile_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string sourceMap;
  SourceMapTest_SourceMapSourceRootFile_Test *this_local;
  
  sourceMap.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "\n    {\n      \"version\":3,\n      \"file\": \"foo.wasm\",\n      \"sources\":[],\n      \"names\":[],\n      \"mappings\": \"\",\n      \"sourceRoot\": \"/foo/bar\"\n    }\n  "
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  SourceMapTest::parseMap(&this->super_SourceMapTest,(string *)local_30);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_58,"wasm.debugInfoSourceRoot","\"/foo/bar\"",
             &(this->super_SourceMapTest).wasm.debugInfoSourceRoot,(char (*) [9])"/foo/bar");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_78,"wasm.debugInfoFile","\"foo.wasm\"",
             &(this->super_SourceMapTest).wasm.debugInfoFile,(char (*) [9])"foo.wasm");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(SourceMapTest, SourceMapSourceRootFile) {
  std::string sourceMap = R"(
    {
      "version":3,
      "file": "foo.wasm",
      "sources":[],
      "names":[],
      "mappings": "",
      "sourceRoot": "/foo/bar"
    }
  )";
  parseMap(sourceMap);
  EXPECT_EQ(wasm.debugInfoSourceRoot, "/foo/bar");
  EXPECT_EQ(wasm.debugInfoFile, "foo.wasm");
}